

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O1

void stl_reader::stl_reader_impl::
     RemoveDoubles<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<double,_std::allocator<double>_> *uniqueCoordsOut,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *trisInOut,
               vector<double,_std::allocator<double>_> *normalsInOut,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *solidsInOut,
               vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
               *coordsWithIndexInOut)

{
  pointer pCVar1;
  pointer pdVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  size_type __new_size;
  uint uVar11;
  pointer pCVar12;
  ulong uVar13;
  index_t j;
  uint uVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newSolids;
  index_t ni [3];
  index_t newTriInd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  uint local_60 [4];
  vector<double,_std::allocator<double>_> *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pCVar1 = (coordsWithIndexInOut->
           super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar12 = (coordsWithIndexInOut->
            super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = normalsInOut;
  if (pCVar1 != pCVar12) {
    uVar6 = (long)pCVar12 - (long)pCVar1 >> 5;
    lVar8 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>*,std::vector<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pCVar1,pCVar12,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>*,std::vector<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pCVar1,pCVar12);
  }
  pCVar1 = (coordsWithIndexInOut->
           super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(coordsWithIndexInOut->
                super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 5;
  __new_size = 3;
  if (1 < uVar6) {
    lVar8 = uVar6 - 1;
    pdVar7 = pCVar1[1].data + 2;
    iVar9 = 1;
    do {
      uVar10 = 1;
      if ((pdVar7[-6] == ((CoordWithIndex<double,_unsigned_int> *)(pdVar7 + -2))->data[0]) &&
         (!NAN(pdVar7[-6]) && !NAN(((CoordWithIndex<double,_unsigned_int> *)(pdVar7 + -2))->data[0])
         )) {
        uVar10 = 1;
        if ((pdVar7[-5] == pdVar7[-1]) && (!NAN(pdVar7[-5]) && !NAN(pdVar7[-1]))) {
          uVar10 = -(uint)(*pdVar7 != pdVar7[-4]) & 1;
        }
      }
      iVar9 = iVar9 + uVar10;
      pdVar7 = pdVar7 + 4;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    __new_size = (size_type)(uint)(iVar9 * 3);
  }
  std::vector<double,_std::allocator<double>_>::resize(uniqueCoordsOut,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,
             (long)(coordsWithIndexInOut->
                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(coordsWithIndexInOut->
                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_78);
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (coordsWithIndexInOut->
           super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[pCVar1->index] = 0;
  pdVar2 = (uniqueCoordsOut->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = 0;
  do {
    pdVar2[lVar8] = pCVar1->data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  uVar6 = (long)(coordsWithIndexInOut->
                super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 5;
  if (1 < uVar6) {
    pdVar2 = (uniqueCoordsOut->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    uVar13 = 1;
    pCVar12 = pCVar1;
    do {
      pCVar12 = pCVar12 + 1;
      uVar14 = pCVar1[uVar13].index;
      if ((pCVar1[uVar13 - 1].data[0] != pCVar1[uVar13].data[0]) ||
         (NAN(pCVar1[uVar13 - 1].data[0]) || NAN(pCVar1[uVar13].data[0]))) {
LAB_0011f262:
        uVar10 = uVar10 + 1;
        lVar8 = 0;
        do {
          pdVar2[uVar10 * 3 + (int)lVar8] = pCVar12->data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
      }
      else {
        if ((pCVar1[uVar13 - 1].data[1] != pCVar1[uVar13].data[1]) ||
           (NAN(pCVar1[uVar13 - 1].data[1]) || NAN(pCVar1[uVar13].data[1]))) goto LAB_0011f262;
        if ((pCVar1[uVar13 - 1].data[2] != pCVar1[uVar13].data[2]) ||
           (NAN(pCVar1[uVar13 - 1].data[2]) || NAN(pCVar1[uVar13].data[2]))) goto LAB_0011f262;
      }
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14] = uVar10;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6);
  }
  if ((trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    uVar10 = 0;
  }
  else {
    uVar14 = 0;
    uVar10 = 0;
    do {
      local_60[3] = uVar10 / 3;
      puVar3 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start) <
           (ulong)((long)(solidsInOut->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar3)) &&
         (*(uint *)((long)puVar3 +
                   ((long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start)) <= uVar14 / 3)) {
        if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,local_60 + 3);
        }
        else {
          *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_60[3];
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar3 = (trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        local_60[lVar8] =
             local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[puVar3[uVar14 + (int)lVar8]];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      if ((local_60[0] != local_60[1]) && (local_60[1] != local_60[2] && local_60[0] != local_60[2])
         ) {
        puVar3 = (trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar2 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = 0;
        do {
          uVar11 = (int)lVar8 + uVar10;
          puVar3[uVar11] = local_60[lVar8];
          pdVar2[uVar11] = pdVar2[uVar14 + (int)lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        uVar10 = uVar10 + 3;
      }
      uVar14 = uVar14 + 3;
      uVar6 = (long)(trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(trisInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2;
    } while (uVar14 < uVar6);
  }
  uVar13 = (ulong)uVar10;
  if (uVar13 < uVar6) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(trisInOut,uVar13);
    std::vector<double,_std::allocator<double>_>::resize(local_50,uVar13);
  }
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_60[0] = uVar10 / 3;
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_78,
                 (iterator)
                 local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_60);
    }
    else {
      *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_60[0];
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  puVar3 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (solidsInOut->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar3;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar4;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar5;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar5 - (long)puVar3);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RemoveDoubles (TNumberContainer1& uniqueCoordsOut,
                      TIndexContainer1& trisInOut,
                      TNumberContainer2& normalsInOut,
                      TIndexContainer2& solidsInOut,
                      std::vector <CoordWithIndex<
                        typename TNumberContainer1::value_type,
                        typename TIndexContainer1::value_type> >
                        &coordsWithIndexInOut)
  {
    using namespace std;

    typedef typename TNumberContainer1::value_type number_t;
    typedef typename TIndexContainer1::value_type  index_t;

    sort (coordsWithIndexInOut.begin(), coordsWithIndexInOut.end());
  
  //  first count unique indices
    index_t numUnique = 1;
    for(size_t i = 1; i < coordsWithIndexInOut.size(); ++i){
      if(coordsWithIndexInOut[i] != coordsWithIndexInOut[i - 1])
        ++numUnique;
    }

    uniqueCoordsOut.resize (numUnique * 3);
    vector<index_t> newIndex (coordsWithIndexInOut.size());

    TIndexContainer2 newSolids;

  //  copy unique coordinates to 'uniqueCoordsOut' and create an index-map
  //  'newIndex', which allows to re-index triangles later on.
    index_t curInd = 0;
    newIndex[coordsWithIndexInOut[0].index] = 0;
    for(index_t i = 0; i < 3; ++i)
      uniqueCoordsOut[i] = coordsWithIndexInOut[0][i];

    for(size_t i = 1; i < coordsWithIndexInOut.size(); ++i){
      const CoordWithIndex <number_t, index_t> c = coordsWithIndexInOut[i];
      if(c != coordsWithIndexInOut[i - 1]){
        ++curInd;
        for(index_t j = 0; j < 3; ++j)
          uniqueCoordsOut[curInd * 3 + j] = coordsWithIndexInOut[i][j];
      }

      newIndex[c.index] = static_cast<index_t> (curInd);
    }

  //  re-index triangles, so that they refer to 'uniqueCoordsOut'
  //  make sure to only add triangles which refer to three different indices
    index_t numUniqueTriInds = 0;
    for(index_t i = 0; i < trisInOut.size(); i+=3){
      
      const index_t triInd = i / 3;
      const index_t newTriInd = numUniqueTriInds / 3;
      if (newSolids.size () < solidsInOut.size () &&
          solidsInOut [newSolids.size ()] <= triInd)
      {
        newSolids.push_back (newTriInd);
      }

      index_t ni[3];
      for(index_t j = 0; j < 3; ++j)
        ni[j] = newIndex[trisInOut[i+j]];

      if((ni[0] != ni[1]) && (ni[0] != ni[2]) && (ni[1] != ni[2])){
        for(index_t j = 0; j < 3; ++j)
        {
          trisInOut[numUniqueTriInds + j] = ni[j];
          normalsInOut[numUniqueTriInds + j] = normalsInOut [i + j];
        }
        numUniqueTriInds += 3;
      }
    }

    if(numUniqueTriInds < trisInOut.size())
    {
      trisInOut.resize (numUniqueTriInds);
      normalsInOut.resize (numUniqueTriInds);
    }

    if (!newSolids.empty ())
      newSolids.push_back (numUniqueTriInds / 3);
    
    using std::swap;
    swap (solidsInOut, newSolids);
  }